

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpElementContent(xmlOutputBufferPtr buf,xmlElementContentPtr content)

{
  xmlElementContentType xVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  xmlElementContentPtr parent;
  xmlElementContentPtr cur;
  xmlElementContentPtr content_local;
  xmlOutputBufferPtr buf_local;
  
  if (content != (xmlElementContentPtr)0x0) {
    xmlOutputBufferWrite(buf,1,"(");
    parent = content;
    do {
      if (parent == (xmlElementContentPtr)0x0) {
        return;
      }
      xVar1 = parent->type;
      if (xVar1 == XML_ELEMENT_CONTENT_PCDATA) {
        xmlOutputBufferWrite(buf,7,"#PCDATA");
LAB_001a0f56:
        do {
          if (parent == content) goto LAB_001a1033;
          p_Var2 = parent->parent;
          if (p_Var2 == (_xmlElementContent *)0x0) {
            return;
          }
          if (((parent->type == XML_ELEMENT_CONTENT_OR) || (parent->type == XML_ELEMENT_CONTENT_SEQ)
              ) && ((parent->type != p_Var2->type || (parent->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlOutputBufferWrite(buf,1,")");
          }
          xmlBufDumpElementOccur(buf,parent);
          bVar3 = parent != p_Var2->c1;
          parent = p_Var2;
        } while (bVar3);
        if (p_Var2->type == XML_ELEMENT_CONTENT_SEQ) {
          xmlOutputBufferWrite(buf,3," , ");
        }
        else if (p_Var2->type == XML_ELEMENT_CONTENT_OR) {
          xmlOutputBufferWrite(buf,3," | ");
        }
        parent = p_Var2->c2;
      }
      else {
        if (xVar1 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (parent->prefix != (xmlChar *)0x0) {
            xmlOutputBufferWriteString(buf,(char *)parent->prefix);
            xmlOutputBufferWrite(buf,1,":");
          }
          xmlOutputBufferWriteString(buf,(char *)parent->name);
          goto LAB_001a0f56;
        }
        if (1 < xVar1 - XML_ELEMENT_CONTENT_SEQ) goto LAB_001a0f56;
        if (((parent != content) && (parent->parent != (_xmlElementContent *)0x0)) &&
           ((parent->type != parent->parent->type || (parent->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlOutputBufferWrite(buf,1,"(");
        }
        parent = parent->c1;
      }
LAB_001a1033:
    } while (parent != content);
    xmlOutputBufferWrite(buf,1,")");
    xmlBufDumpElementOccur(buf,content);
  }
  return;
}

Assistant:

static void
xmlBufDumpElementContent(xmlOutputBufferPtr buf,
                         xmlElementContentPtr content) {
    xmlElementContentPtr cur;

    if (content == NULL) return;

    xmlOutputBufferWrite(buf, 1, "(");
    cur = content;

    do {
        if (cur == NULL) return;

        switch (cur->type) {
            case XML_ELEMENT_CONTENT_PCDATA:
                xmlOutputBufferWrite(buf, 7, "#PCDATA");
                break;
            case XML_ELEMENT_CONTENT_ELEMENT:
                if (cur->prefix != NULL) {
                    xmlOutputBufferWriteString(buf,
                            (const char *) cur->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *) cur->name);
                break;
            case XML_ELEMENT_CONTENT_SEQ:
            case XML_ELEMENT_CONTENT_OR:
                if ((cur != content) &&
                    (cur->parent != NULL) &&
                    ((cur->type != cur->parent->type) ||
                     (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                    xmlOutputBufferWrite(buf, 1, "(");
                cur = cur->c1;
                continue;
        }

        while (cur != content) {
            xmlElementContentPtr parent = cur->parent;

            if (parent == NULL) return;

            if (((cur->type == XML_ELEMENT_CONTENT_OR) ||
                 (cur->type == XML_ELEMENT_CONTENT_SEQ)) &&
                ((cur->type != parent->type) ||
                 (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                xmlOutputBufferWrite(buf, 1, ")");
            xmlBufDumpElementOccur(buf, cur);

            if (cur == parent->c1) {
                if (parent->type == XML_ELEMENT_CONTENT_SEQ)
                    xmlOutputBufferWrite(buf, 3, " , ");
                else if (parent->type == XML_ELEMENT_CONTENT_OR)
                    xmlOutputBufferWrite(buf, 3, " | ");

                cur = parent->c2;
                break;
            }

            cur = parent;
        }
    } while (cur != content);

    xmlOutputBufferWrite(buf, 1, ")");
    xmlBufDumpElementOccur(buf, content);
}